

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

block * lsvm::bytecode::new_bytecode_block(uint32_t v_copy,bytecode *bytecode)

{
  block *pbVar1;
  uint32_t *in_RSI;
  uint32_t in_EDI;
  block *b;
  size_t in_stack_ffffffffffffffe8;
  
  pbVar1 = (block *)memory::allocate(in_stack_ffffffffffffffe8);
  pbVar1->v_args = *in_RSI;
  pbVar1->v_copy = in_EDI;
  pbVar1->v_temp = in_RSI[1];
  pbVar1->op = *(bytecode_op_t **)(in_RSI + 2);
  return pbVar1;
}

Assistant:

block* new_bytecode_block(uint32_t v_copy, bytecode* bytecode){
    block* b = (block*)lsvm::memory::allocate(
            sizeof(block)+(v_copy*sizeof(variable))
            );
    b->v_args = bytecode->v_args;
    b->v_copy = v_copy;
    b->v_temp = bytecode->v_temp;
    b->op = bytecode->op;
    return b;
}